

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O2

void __thiscall QTemporaryFilePrivate::materializeUnnamedFile(QTemporaryFilePrivate *this)

{
  QAbstractFileEngine *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_QFilePrivate).fileName.d.size == 0) &&
     (pQVar1 = (this->super_QFilePrivate).super_QFileDevicePrivate.fileEngine._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
     pQVar1 != (QAbstractFileEngine *)0x0)) {
    (*pQVar1->_vptr_QAbstractFileEngine[0x19])(&local_38,pQVar1,0);
    pDVar3 = (this->super_QFilePrivate).fileName.d.d;
    pcVar4 = (this->super_QFilePrivate).fileName.d.ptr;
    (this->super_QFilePrivate).fileName.d.d = local_38.d;
    (this->super_QFilePrivate).fileName.d.ptr = local_38.ptr;
    qVar2 = (this->super_QFilePrivate).fileName.d.size;
    (this->super_QFilePrivate).fileName.d.size = local_38.size;
    local_38.d = pDVar3;
    local_38.ptr = pcVar4;
    local_38.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTemporaryFilePrivate::materializeUnnamedFile()
{
#ifdef LINUX_UNNAMED_TMPFILE
    if (!fileName.isEmpty() || !fileEngine)
        return;

    auto *tef = static_cast<QTemporaryFileEngine *>(fileEngine.get());
    fileName = tef->fileName(QAbstractFileEngine::DefaultName);
#endif
}